

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_observation.cc
# Opt level: O1

void __thiscall
hanabi_learning_env::HanabiObservation::HanabiObservation
          (HanabiObservation *this,HanabiState *state,int observing_player)

{
  vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_> *this_00
  ;
  pointer *ppHVar1;
  byte bVar2;
  AgentObservationType AVar3;
  HanabiGame *pHVar4;
  pointer pHVar5;
  iterator __position;
  ulong uVar6;
  int8_t iVar7;
  bool bVar8;
  bool bVar9;
  int8_t iVar10;
  int8_t iVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  int8_t iVar14;
  pointer pHVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  pointer pHVar19;
  HanabiHistoryItem *__args;
  HanabiHand local_60;
  
  iVar16 = state->cur_player_;
  if (-1 < iVar16) {
    iVar18 = state->parent_game_->num_players_;
    iVar16 = ((iVar16 - observing_player) + iVar18) % iVar18;
  }
  this->cur_player_offset_ = iVar16;
  this_00 = &this->hands_;
  (this->hands_).
  super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hands_).
  super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hands_).
  super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  vector(&this->discard_pile_,&state->discard_pile_);
  std::vector<int,_std::allocator<int>_>::vector(&this->fireworks_,&state->fireworks_);
  this->deck_size_ = (state->deck_).total_count_;
  (this->last_moves_).
  super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->last_moves_).
  super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->last_moves_).
  super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar16 = state->life_tokens_;
  this->information_tokens_ = state->information_tokens_;
  this->life_tokens_ = iVar16;
  HanabiState::LegalMoves(&this->legal_moves_,state,observing_player);
  pHVar4 = state->parent_game_;
  this->parent_game_ = pHVar4;
  if ((observing_player < 0) || (pHVar4->num_players_ <= observing_player)) {
    __assert_fail("observing_player >= 0 && observing_player < state.ParentGame()->NumPlayers()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_observation.cc"
                  ,0x40,
                  "hanabi_learning_env::HanabiObservation::HanabiObservation(const HanabiState &, int)"
                 );
  }
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  reserve(this_00,((long)(state->hands_).
                         super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(state->hands_).
                         super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  AVar3 = state->parent_game_->observation_type_;
  HanabiHand::HanabiHand
            (&local_60,
             (state->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start + (uint)observing_player,AVar3 != kSeer,
             AVar3 == kMinimal);
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  emplace_back<hanabi_learning_env::HanabiHand>(this_00,&local_60);
  std::
  vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ::~vector(&local_60.card_knowledge_);
  if (local_60.cards_.
      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.cards_.
                    super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar16 = state->parent_game_->num_players_;
  if (1 < iVar16) {
    iVar18 = 1;
    do {
      HanabiHand::HanabiHand
                (&local_60,
                 (state->hands_).
                 super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 ((long)(iVar18 + observing_player) % (long)iVar16 & 0xffffffff),false,
                 AVar3 == kMinimal);
      std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
      ::emplace_back<hanabi_learning_env::HanabiHand>(this_00,&local_60);
      std::
      vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
      ::~vector(&local_60.card_knowledge_);
      if (local_60.cards_.
          super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.cards_.
                        super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar18 = iVar18 + 1;
      iVar16 = state->parent_game_->num_players_;
    } while (iVar18 < iVar16);
  }
  pHVar19 = (state->move_history_).
            super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pHVar5 = (state->move_history_).
           super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar17 = (long)pHVar5 - (long)pHVar19 >> 6;
  pHVar15 = pHVar19;
  if (0 < lVar17) {
    pHVar15 = (pointer)((long)&(pHVar19->move).move_type_ +
                       ((long)pHVar5 - (long)pHVar19 & 0xffffffffffffffc0U));
    lVar17 = lVar17 + 1;
    pHVar19 = pHVar19 + 2;
    do {
      if (pHVar19[-2].player != -1) {
        pHVar19 = pHVar19 + -2;
        goto LAB_00114c0f;
      }
      if (pHVar19[-1].player != -1) {
        pHVar19 = pHVar19 + -1;
        goto LAB_00114c0f;
      }
      if (pHVar19->player != -1) goto LAB_00114c0f;
      if (pHVar19[1].player != -1) {
        pHVar19 = pHVar19 + 1;
        goto LAB_00114c0f;
      }
      lVar17 = lVar17 + -1;
      pHVar19 = pHVar19 + 4;
    } while (1 < lVar17);
  }
  lVar17 = (long)pHVar5 - (long)pHVar15 >> 4;
  if (lVar17 != 1) {
    if (lVar17 != 2) {
      pHVar19 = pHVar5;
      if ((lVar17 != 3) || (pHVar19 = pHVar15, pHVar15->player != -1)) goto LAB_00114c0f;
      pHVar15 = pHVar15 + 1;
    }
    pHVar19 = pHVar15;
    if (pHVar15->player != -1) goto LAB_00114c0f;
    pHVar15 = pHVar15 + 1;
  }
  pHVar19 = pHVar15;
  if (pHVar15->player == -1) {
    pHVar19 = pHVar5;
  }
LAB_00114c0f:
  do {
    __args = pHVar5 + -1;
    if (pHVar5 == pHVar19) {
      return;
    }
    __position._M_current =
         (this->last_moves_).
         super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->last_moves_).
        super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<hanabi_learning_env::HanabiHistoryItem,std::allocator<hanabi_learning_env::HanabiHistoryItem>>
      ::_M_realloc_insert<hanabi_learning_env::HanabiHistoryItem_const&>
                ((vector<hanabi_learning_env::HanabiHistoryItem,std::allocator<hanabi_learning_env::HanabiHistoryItem>>
                  *)&this->last_moves_,__position,__args);
    }
    else {
      iVar7 = pHVar5[-1].player;
      bVar8 = pHVar5[-1].scored;
      bVar9 = pHVar5[-1].information_token;
      iVar10 = pHVar5[-1].color;
      iVar11 = pHVar5[-1].rank;
      uVar12 = pHVar5[-1].reveal_bitmask;
      uVar13 = pHVar5[-1].newly_revealed_bitmask;
      iVar14 = pHVar5[-1].deal_to_player;
      (__position._M_current)->move = __args->move;
      (__position._M_current)->player = iVar7;
      (__position._M_current)->scored = bVar8;
      (__position._M_current)->information_token = bVar9;
      (__position._M_current)->color = iVar10;
      (__position._M_current)->rank = iVar11;
      (__position._M_current)->reveal_bitmask = uVar12;
      (__position._M_current)->newly_revealed_bitmask = uVar13;
      (__position._M_current)->deal_to_player = iVar14;
      ppHVar1 = &(this->last_moves_).
                 super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
    iVar16 = state->parent_game_->num_players_;
    pHVar15 = (this->last_moves_).
              super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = pHVar15[-1].player;
    if (pHVar15[-1].move.move_type_ == kDeal) {
      if ((-1 < (char)bVar2) || (pHVar15[-1].deal_to_player < '\0')) {
        __assert_fail("item->player < 0 && item->deal_to_player >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_observation.cc"
                      ,0x26,
                      "void hanabi_learning_env::(anonymous namespace)::ChangeHistoryItemToObserverRelative(int, int, bool, HanabiHistoryItem *)"
                     );
      }
      uVar6 = (long)((iVar16 - observing_player) + (int)pHVar15[-1].deal_to_player) % (long)iVar16;
      pHVar15[-1].deal_to_player = (int8_t)uVar6;
      if ((AVar3 != kSeer) && ((uVar6 & 0xff) == 0)) {
        pHVar15[-1].move.move_type_ = kDeal;
        pHVar15[-1].move.card_index_ = -1;
        pHVar15[-1].move.target_offset_ = -1;
        pHVar15[-1].move.color_ = -1;
        pHVar15[-1].move.rank_ = -1;
      }
    }
    else {
      if ((char)bVar2 < '\0') {
        __assert_fail("item->player >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_observation.cc"
                      ,0x2e,
                      "void hanabi_learning_env::(anonymous namespace)::ChangeHistoryItemToObserverRelative(int, int, bool, HanabiHistoryItem *)"
                     );
      }
      pHVar15[-1].player = (int8_t)((int)((iVar16 - observing_player) + (uint)bVar2) % iVar16);
    }
    pHVar15 = pHVar5 + -1;
    pHVar5 = __args;
    if (pHVar15->player == observing_player) {
      return;
    }
  } while( true );
}

Assistant:

HanabiObservation::HanabiObservation(const HanabiState& state,
                                     int observing_player)
    : cur_player_offset_(PlayerToOffset(state.CurPlayer(), observing_player,
                                        state.ParentGame()->NumPlayers())),
      discard_pile_(state.DiscardPile()),
      fireworks_(state.Fireworks()),
      deck_size_(state.Deck().Size()),
      information_tokens_(state.InformationTokens()),
      life_tokens_(state.LifeTokens()),
      legal_moves_(state.LegalMoves(observing_player)),
      parent_game_(state.ParentGame()) {
  REQUIRE(observing_player >= 0 &&
          observing_player < state.ParentGame()->NumPlayers());
  hands_.reserve(state.Hands().size());
  const bool hide_knowledge =
      state.ParentGame()->ObservationType() == HanabiGame::kMinimal;
  const bool show_cards = state.ParentGame()->ObservationType() == HanabiGame::kSeer;
  hands_.push_back(
      HanabiHand(state.Hands()[observing_player], !show_cards, hide_knowledge));
  for (int offset = 1; offset < state.ParentGame()->NumPlayers(); ++offset) {
    hands_.push_back(HanabiHand(state.Hands()[(observing_player + offset) %
                                              state.ParentGame()->NumPlayers()],
                                false, hide_knowledge));
  }

  const auto& history = state.MoveHistory();
  auto start = std::find_if(history.begin(), history.end(),
                            [](const HanabiHistoryItem& item) {
                              return item.player != kChancePlayerId;
                            });
  std::reverse_iterator<decltype(start)> rend(start);
  for (auto it = history.rbegin(); it != rend; ++it) {
    last_moves_.push_back(*it);
    ChangeHistoryItemToObserverRelative(observing_player,
                                        state.ParentGame()->NumPlayers(),
                                        show_cards,
                                        &last_moves_.back());
    if (it->player == observing_player) {
      break;
    }
  }
}